

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,uint *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1)

{
  Arg *in_R9;
  string_view data;
  string_view format_00;
  string local_a8;
  Arg local_88;
  Arg local_58;
  
  format_00._M_len = format._M_str;
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_58,*arg);
  local_88.piece_._M_str = (arg_1->_M_dataplus)._M_p;
  local_88.piece_._M_len = arg_1->_M_string_length;
  format_00._M_str = (char *)&local_58;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_a8,(lts_20250127 *)format._M_len,format_00,&local_88,in_R9);
  data._M_str = local_a8._M_dataplus._M_p;
  data._M_len = local_a8._M_string_length;
  Write(this,data);
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }